

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printvisitor.cpp
# Opt level: O0

void __thiscall
PrintVisitor::visit(PrintVisitor *this,Expression *parent,UnaryOperatorExpression *expression)

{
  ostream *poVar1;
  OperatorChar OVar2;
  Expression *pEVar3;
  OperatorChar local_43;
  string local_40;
  UnaryOperatorExpression *local_20;
  UnaryOperatorExpression *expression_local;
  Expression *parent_local;
  PrintVisitor *this_local;
  
  poVar1 = this->mStream;
  local_20 = expression;
  expression_local = (UnaryOperatorExpression *)parent;
  parent_local = (Expression *)this;
  OVar2 = UnaryOperatorExpression::op(expression);
  local_43._0_2_ = OVar2._0_2_;
  local_43.mOp2 = OVar2.mOp2;
  OperatorChar::toString_abi_cxx11_(&local_40,&local_43);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pEVar3 = UnaryOperatorExpression::operand(local_20);
  (*pEVar3->_vptr_Expression[2])(pEVar3,this,local_20);
  return;
}

Assistant:

void PrintVisitor::visit(Expression* parent, UnaryOperatorExpression* expression) {
	mStream << expression->op().toString();
	expression->operand()->accept(*this, expression);
}